

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

string * __thiscall font2svg::glyph::axes_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  ostream *poVar1;
  allocator<char> local_39;
  string local_38 [32];
  glyph *local_18;
  glyph *this_local;
  
  local_18 = this;
  this_local = (glyph *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  std::__cxx11::stringstream::str((string *)&this->tmp);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::operator<<((ostream *)&this->field_0x270,"\n\n  <!-- draw axes --> ");
  poVar1 = std::operator<<((ostream *)&this->field_0x270,
                           "\n <path stroke=\'blue\' stroke-dasharray=\'5,5\' d=\'");
  poVar1 = std::operator<<(poVar1," M");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,-this->bbwidth);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1," L");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbwidth);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1," M");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,-this->bbheight);
  poVar1 = std::operator<<(poVar1," L");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbheight);
  std::operator<<(poVar1," \'/>");
  std::__cxx11::stringstream::str();
  return __return_storage_ptr__;
}

Assistant:

std::string axes()  {
		tmp.str("");
		tmp << "\n\n  <!-- draw axes --> ";
		tmp << "\n <path stroke='blue' stroke-dasharray='5,5' d='"
			<< " M" << -bbwidth << "," << 0
			<< " L" <<  bbwidth << "," << 0
			<< " M" << 0 << "," << -bbheight
			<< " L" << 0 << "," << bbheight
			<< " '/>";
		return tmp.str();
	}